

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O3

int float32_lt_m68k(float32 a,float32 b,float_status *status)

{
  bool bVar1;
  byte bVar2;
  bool bVar3;
  
  if (status->flush_inputs_to_zero != '\0') {
    if ((a & 0x7fffff) != 0 && (a & 0x7f800000) == 0) {
      status->float_exception_flags = status->float_exception_flags | 0x40;
      a = a & 0x80000000;
    }
    if ((b & 0x7fffff) != 0 && (b & 0x7f800000) == 0) {
      status->float_exception_flags = status->float_exception_flags | 0x40;
      b = b & 0x80000000;
    }
  }
  if (((~a & 0x7f800000) == 0 && (a & 0x7fffff) != 0) ||
     ((b & 0x7fffff) != 0 && (~b & 0x7f800000) == 0)) {
    status->float_exception_flags = status->float_exception_flags | 1;
    bVar2 = 0;
  }
  else {
    if ((int)(b ^ a) < 0) {
      bVar3 = ((b | a) & 0x7fffffff) != 0;
      bVar1 = (int)a < 0;
    }
    else {
      bVar3 = a != b;
      bVar1 = (int)a < 0 != a < b;
    }
    bVar2 = bVar1 & bVar3;
  }
  return (int)bVar2;
}

Assistant:

float32 float32_squash_input_denormal(float32 a, float_status *status)
{
    if (status->flush_inputs_to_zero) {
        FloatParts p = float32_unpack_raw(a);
        if (parts_squash_denormal(p, status)) {
            return float32_set_sign(float32_zero, p.sign);
        }
    }
    return a;
}